

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O3

collision_shape_ptr __thiscall
APhyBullet::BulletEngine::createConeY(BulletEngine *this,aphy_scalar radius,aphy_scalar height)

{
  btConeShape *this_00;
  BulletCollisionShape *this_01;
  collision_shape_ptr prVar1;
  
  this_00 = (btConeShape *)btAlignedAllocInternal(0x60,0x10);
  btConeShape::btConeShape(this_00,radius,height);
  this_01 = (BulletCollisionShape *)operator_new(0x20);
  BulletCollisionShape::BulletCollisionShape(this_01,(btCollisionShape *)this_00,Generic);
  prVar1 = (collision_shape_ptr)operator_new(0x18);
  prVar1->dispatchTable = (aphy_icd_dispatch *)aphy::cppRefcountedDispatchTable;
  prVar1->object = (collision_shape *)this_01;
  prVar1->strongCount = (__atomic_base<unsigned_int>)0x1;
  prVar1->weakCount = (__atomic_base<unsigned_int>)0x0;
  (this_01->super_collision_shape).super_base_interface.myRefCounter = prVar1;
  return prVar1;
}

Assistant:

collision_shape_ptr BulletEngine::createConeY(aphy_scalar radius, aphy_scalar height)
{
    return makeObject<BulletCollisionShape> (
        new btConeShape(radius, height)
    ).disown();
}